

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals __thiscall Omega_h::matrices_times_matrices_dim<2>(Omega_h *this,Reals *a,Reals *b)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_108;
  undefined1 local_f8 [8];
  type f;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  Write<double> out;
  int n;
  Reals *b_local;
  Reals *a_local;
  ulong local_38;
  ulong local_28;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_28 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_28 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_28 >> 3),4);
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_38 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_38 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_38 >> 3) == out.shared_alloc_.direct_ptr._4_4_ * 4) {
    size_in = out.shared_alloc_.direct_ptr._4_4_ * 4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"",&local_b1);
    Write<double>::Write((Write<double> *)local_90,size_in,(string *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    Write<double>::Write((Write<double> *)local_f8,(Write<double> *)local_90);
    Read<double>::Read((Read<double> *)&f.out.shared_alloc_.direct_ptr,a);
    Read<double>::Read((Read<double> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    parallel_for<Omega_h::matrices_times_matrices_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
              (out.shared_alloc_.direct_ptr._4_4_,(type *)local_f8,"matrices_times_matrices");
    Write<double>::Write(&local_108,(Write<signed_char> *)local_90);
    Read<double>::Read((Read<double> *)this,&local_108);
    Write<double>::~Write(&local_108);
    matrices_times_matrices_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::
    ~Read((_lambda_int__1_ *)local_f8);
    Write<double>::~Write((Write<double> *)local_90);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","b.size() == n * matrix_ncomps(dim, dim)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
       ,0x48);
}

Assistant:

Reals matrices_times_matrices_dim(Reals a, Reals b) {
  auto n = divide_no_remainder(a.size(), matrix_ncomps(dim, dim));
  OMEGA_H_CHECK(b.size() == n * matrix_ncomps(dim, dim));
  auto out = Write<Real>(n * matrix_ncomps(dim, dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_matrix(out, i, get_matrix<dim, dim>(a, i) * get_matrix<dim, dim>(b, i));
  };
  parallel_for(n, f, "matrices_times_matrices");
  return out;
}